

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O3

void __thiscall
Eigen::
GeneralProduct<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>,Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,5>
::scaleAndAddTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (GeneralProduct<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>,Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,5>
           *this,Matrix<double,__1,__1,_0,__1,__1> *dst,Scalar *alpha)

{
  gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
  local_a0;
  undefined1 auStack_78 [8];
  BlockingType blocking;
  
  blocking.super_level3_blocking<double,_double>.m_blockW =
       (RhsScalar *)
       (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((blocking.super_level3_blocking<double,_double>.m_blockW == *(RhsScalar **)(this + 8)) &&
     (blocking.super_level3_blocking<double,_double>.m_mc =
           (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols,
     blocking.super_level3_blocking<double,_double>.m_mc == *(long *)(this + 0x38))) {
    blocking.m_sizeW = (DenseIndex)*alpha;
    blocking.super_level3_blocking<double,_double>.m_nc = *(DenseIndex *)(this + 0x10);
    auStack_78 = (undefined1  [8])0x0;
    blocking.super_level3_blocking<double,_double>.m_blockA = (LhsScalar *)0x0;
    blocking.super_level3_blocking<double,_double>.m_blockB = (RhsScalar *)0x0;
    internal::computeProductBlockingSizes<double,double,1,long>
              (&blocking.super_level3_blocking<double,_double>.m_nc,
               (long *)&blocking.super_level3_blocking<double,_double>.m_blockW,
               &blocking.super_level3_blocking<double,_double>.m_mc);
    blocking.super_level3_blocking<double,_double>.m_kc =
         (long)blocking.super_level3_blocking<double,_double>.m_blockW *
         blocking.super_level3_blocking<double,_double>.m_nc;
    blocking.m_sizeA =
         blocking.super_level3_blocking<double,_double>.m_mc *
         blocking.super_level3_blocking<double,_double>.m_nc;
    blocking.m_sizeB = blocking.super_level3_blocking<double,_double>.m_nc << 3;
    local_a0.m_actualAlpha = (double)blocking.m_sizeW;
    local_a0.m_blocking = (gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> *)auStack_78
    ;
    local_a0.m_lhs =
         (Map<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)this;
    local_a0.m_rhs =
         (Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)(this + 0x28);
    local_a0.m_dest = dst;
    internal::
    gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>,_Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>_>
    ::operator()(&local_a0,0,*(long *)(this + 8),0,*(long *)(this + 0x38),
                 (GemmParallelInfo<long> *)0x0);
    free((void *)auStack_78);
    free(blocking.super_level3_blocking<double,_double>.m_blockA);
    free(blocking.super_level3_blocking<double,_double>.m_blockB);
    return;
  }
  __assert_fail("dst.rows()==m_lhs.rows() && dst.cols()==m_rhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/products/GeneralMatrixMatrix.h"
                ,399,
                "void Eigen::GeneralProduct<Eigen::Map<const Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, 5>::scaleAndAddTo(Dest &, const Scalar &) const [Lhs = Eigen::Map<const Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, Rhs = Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, ProductType = 5, Dest = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

void scaleAndAddTo(Dest& dst, const Scalar& alpha) const
    {
      eigen_assert(dst.rows()==m_lhs.rows() && dst.cols()==m_rhs.cols());

      typename internal::add_const_on_value_type<ActualLhsType>::type lhs = LhsBlasTraits::extract(m_lhs);
      typename internal::add_const_on_value_type<ActualRhsType>::type rhs = RhsBlasTraits::extract(m_rhs);

      Scalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(m_lhs)
                                 * RhsBlasTraits::extractScalarFactor(m_rhs);

      typedef internal::gemm_blocking_space<(Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,LhsScalar,RhsScalar,
              Dest::MaxRowsAtCompileTime,Dest::MaxColsAtCompileTime,MaxDepthAtCompileTime> BlockingType;

      typedef internal::gemm_functor<
        Scalar, Index,
        internal::general_matrix_matrix_product<
          Index,
          LhsScalar, (_ActualLhsType::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(LhsBlasTraits::NeedToConjugate),
          RhsScalar, (_ActualRhsType::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(RhsBlasTraits::NeedToConjugate),
          (Dest::Flags&RowMajorBit) ? RowMajor : ColMajor>,
        _ActualLhsType, _ActualRhsType, Dest, BlockingType> GemmFunctor;

      BlockingType blocking(dst.rows(), dst.cols(), lhs.cols());

      internal::parallelize_gemm<(Dest::MaxRowsAtCompileTime>32 || Dest::MaxRowsAtCompileTime==Dynamic)>(GemmFunctor(lhs, rhs, dst, actualAlpha, blocking), this->rows(), this->cols(), Dest::Flags&RowMajorBit);
    }